

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_writer.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::ZipWriter::Write(ZipWriter *this,string *filename,string *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  size_type sVar3;
  ZeroCopyOutputStream *pZVar4;
  pointer pcVar5;
  ZeroCopyOutputStream **ppZVar6;
  size_type sVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  bool bVar10;
  int iVar11;
  undefined4 extraout_var;
  EpsCopyOutputStream *pEVar12;
  uint8_t *ptr;
  size_type sVar13;
  uint8_t *puVar14;
  int size;
  CodedOutputStream output;
  FileInfo info;
  void *data;
  uint local_bc;
  CodedOutputStream local_b8;
  value_type local_68;
  EpsCopyOutputStream *local_38;
  
  paVar1 = &local_68.name.field_2;
  local_68.name._M_string_length = 0;
  local_68.name.field_2._M_local_buf[0] = '\0';
  local_68.name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_assign((string *)&local_68);
  sVar7 = filename->_M_string_length;
  local_68.offset = (*this->raw_output_->_vptr_ZeroCopyOutputStream[4])();
  sVar3 = contents->_M_string_length;
  local_68.size = (uint32_t)sVar3;
  if (sVar3 == 0) {
    local_68.crc32 = 0;
  }
  else {
    local_68.crc32 = 0xffffffff;
    sVar13 = 0;
    do {
      local_68.crc32 =
           local_68.crc32 >> 8 ^
           *(uint *)(kCRC32Table +
                    (ulong)(byte)((contents->_M_dataplus)._M_p[sVar13] ^ (byte)local_68.crc32) * 4);
      sVar13 = sVar13 + 1;
    } while (sVar3 != sVar13);
    local_68.crc32 = ~local_68.crc32;
  }
  std::
  vector<google::protobuf::compiler::ZipWriter::FileInfo,_std::allocator<google::protobuf::compiler::ZipWriter::FileInfo>_>
  ::push_back(&this->files_,&local_68);
  pZVar4 = this->raw_output_;
  local_b8.impl_.is_serialization_deterministic_ =
       (bool)(io::CodedOutputStream::default_serialization_deterministic_ & 1);
  puVar14 = local_b8.impl_.buffer_;
  local_b8.impl_.had_error_ = false;
  local_b8.impl_.aliasing_enabled_ = false;
  local_b8.impl_.skip_check_consistency = false;
  local_b8.impl_.end_ = puVar14;
  local_b8.impl_.buffer_end_ = puVar14;
  local_b8.impl_.stream_ = pZVar4;
  local_b8.cur_ = puVar14;
  iVar11 = (*pZVar4->_vptr_ZeroCopyOutputStream[4])(pZVar4);
  local_b8.start_count_ = CONCAT44(extraout_var,iVar11);
  iVar11 = (*pZVar4->_vptr_ZeroCopyOutputStream[2])(pZVar4,&local_38,&local_bc);
  if (((byte)iVar11 & 0 < (int)local_bc) == 1) {
    ppZVar6 = &local_38[-1].stream_;
    if ((int)local_bc < 0x11) {
      ppZVar6 = (ZeroCopyOutputStream **)puVar14;
    }
    local_b8.impl_.end_ = (uint8_t *)((long)ppZVar6 + (ulong)local_bc);
    local_b8.impl_.buffer_end_ = (uint8_t *)local_38;
    local_b8.cur_ = puVar14;
    if (0x10 < (int)local_bc) {
      local_b8.impl_.buffer_end_ = (uint8_t *)(EpsCopyOutputStream *)0x0;
      local_b8.cur_ = (uint8_t *)local_38;
    }
  }
  if (local_b8.impl_.end_ <= local_b8.cur_) {
    local_b8.cur_ = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_b8.impl_,local_b8.cur_);
  }
  *(undefined4 *)&((EpsCopyOutputStream *)local_b8.cur_)->end_ = 0x4034b50;
  local_b8.cur_ = (uint8_t *)((long)&((EpsCopyOutputStream *)local_b8.cur_)->end_ + 4);
  WriteShort(&local_b8,10);
  WriteShort(&local_b8,0);
  WriteShort(&local_b8,0);
  WriteShort(&local_b8,0);
  WriteShort(&local_b8,0x21);
  uVar9 = local_68.crc32;
  if (local_b8.impl_.end_ <= local_b8.cur_) {
    local_b8.cur_ = io::EpsCopyOutputStream::EnsureSpaceFallback(&local_b8.impl_,local_b8.cur_);
  }
  uVar8 = local_68.size;
  *(uint32_t *)&((EpsCopyOutputStream *)local_b8.cur_)->end_ = uVar9;
  pEVar12 = (EpsCopyOutputStream *)((long)&((EpsCopyOutputStream *)local_b8.cur_)->end_ + 4);
  if (local_b8.impl_.end_ <= pEVar12) {
    local_b8.cur_ = (uint8_t *)pEVar12;
    pEVar12 = (EpsCopyOutputStream *)
              io::EpsCopyOutputStream::EnsureSpaceFallback(&local_b8.impl_,(uint8_t *)pEVar12);
  }
  uVar9 = local_68.size;
  *(uint32_t *)&pEVar12->end_ = uVar8;
  pEVar12 = (EpsCopyOutputStream *)((long)&pEVar12->end_ + 4);
  if (local_b8.impl_.end_ <= pEVar12) {
    local_b8.cur_ = (uint8_t *)pEVar12;
    pEVar12 = (EpsCopyOutputStream *)
              io::EpsCopyOutputStream::EnsureSpaceFallback(&local_b8.impl_,(uint8_t *)pEVar12);
  }
  *(uint32_t *)&pEVar12->end_ = uVar9;
  local_b8.cur_ = (uint8_t *)((long)&pEVar12->end_ + 4);
  WriteShort(&local_b8,(uint16_t)sVar7);
  WriteShort(&local_b8,0);
  puVar14 = local_b8.cur_;
  pcVar5 = (filename->_M_dataplus)._M_p;
  uVar2 = (uint)filename->_M_string_length;
  if ((long)local_b8.impl_.end_ - (long)local_b8.cur_ < (long)(int)uVar2) {
    puVar14 = io::EpsCopyOutputStream::WriteRawFallback(&local_b8.impl_,pcVar5,uVar2,local_b8.cur_);
  }
  else {
    memcpy(local_b8.cur_,pcVar5,(ulong)uVar2);
    puVar14 = puVar14 + (int)uVar2;
  }
  pcVar5 = (contents->_M_dataplus)._M_p;
  uVar2 = (uint)contents->_M_string_length;
  local_b8.cur_ = puVar14;
  if ((long)local_b8.impl_.end_ - (long)puVar14 < (long)(int)uVar2) {
    local_b8.cur_ = io::EpsCopyOutputStream::WriteRawFallback(&local_b8.impl_,pcVar5,uVar2,puVar14);
  }
  else {
    memcpy(puVar14,pcVar5,(ulong)uVar2);
    local_b8.cur_ = puVar14 + (int)uVar2;
  }
  bVar10 = io::CodedOutputStream::HadError(&local_b8);
  io::CodedOutputStream::~CodedOutputStream(&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != paVar1) {
    operator_delete(local_68.name._M_dataplus._M_p,
                    CONCAT71(local_68.name.field_2._M_allocated_capacity._1_7_,
                             local_68.name.field_2._M_local_buf[0]) + 1);
  }
  return !bVar10;
}

Assistant:

bool ZipWriter::Write(const std::string& filename,
                      const std::string& contents) {
  FileInfo info;

  info.name = filename;
  uint16_t filename_size = filename.size();
  info.offset = raw_output_->ByteCount();
  info.size = contents.size();
  info.crc32 = ComputeCRC32(contents);

  files_.push_back(info);

  // write file header
  io::CodedOutputStream output(raw_output_);
  output.WriteLittleEndian32(0x04034b50);  // magic
  WriteShort(&output, 10);                 // version needed to extract
  WriteShort(&output, 0);                  // flags
  WriteShort(&output, 0);                  // compression method: stored
  WriteShort(&output, 0);                  // last modified time
  WriteShort(&output, kDosEpoch);          // last modified date
  output.WriteLittleEndian32(info.crc32);  // crc-32
  output.WriteLittleEndian32(info.size);   // compressed size
  output.WriteLittleEndian32(info.size);   // uncompressed size
  WriteShort(&output, filename_size);      // file name length
  WriteShort(&output, 0);                  // extra field length
  output.WriteString(filename);            // file name
  output.WriteString(contents);            // file data

  return !output.HadError();
}